

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O0

void ear::
     mask_write<Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *out,
               CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
               *mask,Matrix<double,__1,_1,_0,__1,_1> *values)

{
  CoeffReturnType CVar1;
  Index IVar2;
  Index IVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  size_t local_48;
  Index i;
  Index j;
  Index values_size;
  Index mask_size;
  Index out_size;
  Matrix<double,__1,_1,_0,__1,_1> *values_local;
  CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
  *mask_local;
  Matrix<double,__1,_1,_0,__1,_1> *out_local;
  
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)out);
  IVar3 = Eigen::
          EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>_>
          ::size((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>_>
                  *)mask);
  IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)values);
  _assert_impl(IVar2 == IVar3,"in mask_write: out_size and mask_write must be the same length");
  i = 0;
  for (local_48 = 0; (long)local_48 < IVar3; local_48 = local_48 + 1) {
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>,_0>
                          *)mask,local_48);
    if (CVar1) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)values,i);
      vec_write<Eigen::Matrix<double,_1,1,0,_1,1>,double>(out,local_48,*pdVar5);
      i = i + 1;
    }
  }
  _assert_impl(i == IVar4,"in mask_size: length of values must equal the number of entries in mask")
  ;
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }